

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestRunner::RunAll(TestRunner *this,TestSuite *ts)

{
  bool bVar1;
  uint uVar2;
  TestCase **ppTVar3;
  uint local_1c;
  int i;
  TestSuite *ts_local;
  TestRunner *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar2 = JetHead::vector<TestCase_*>::size(&ts->mTestCases);
    if ((int)uVar2 <= (int)local_1c) {
      return;
    }
    ppTVar3 = JetHead::vector<TestCase_*>::operator[](&ts->mTestCases,local_1c);
    bVar1 = TestCase::Start(*ppTVar3);
    if (!bVar1) break;
    ppTVar3 = JetHead::vector<TestCase_*>::operator[](&ts->mTestCases,local_1c);
    if (*ppTVar3 != (TestCase *)0x0) {
      (*(*ppTVar3)->_vptr_TestCase[1])();
    }
    ppTVar3 = JetHead::vector<TestCase_*>::operator[](&ts->mTestCases,local_1c);
    *ppTVar3 = (TestCase *)0x0;
    local_1c = local_1c + 1;
  }
  exit(1);
}

Assistant:

void RunAll( TestSuite &ts )
	{
		for( int i = 0; i < (int)ts.mTestCases.size(); i++ )
		{
			LOG_NOTICE( "Running test %s", ts.mTestCases[ i ]->GetTestName() );
			if ( ts.mTestCases[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete ts.mTestCases[ i ];
			ts.mTestCases[ i ] = NULL;
		}
	}